

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O1

char * xmlURIUnescapeString(char *str,int len,char *target)

{
  byte bVar1;
  size_t sVar2;
  byte *pbVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  
  if (str != (char *)0x0) {
    sVar2 = (size_t)(uint)len;
    if (len < 1) {
      sVar2 = strlen(str);
    }
    if (-1 < (int)sVar2) {
      if ((target != (char *)0x0) ||
         (target = (char *)(*xmlMallocAtomic)((size_t)sVar2 + 1), (byte *)target != (byte *)0x0)) {
        pbVar3 = (byte *)target;
        if ((int)sVar2 != 0) {
          do {
            iVar6 = (int)sVar2;
            if ((iVar6 < 3) || (*str != 0x25)) {
LAB_0019139b:
              bVar4 = *str;
              str = (char *)((byte *)str + 1);
              *pbVar3 = bVar4;
              iVar5 = -1;
            }
            else {
              bVar1 = ((byte *)str)[1];
              bVar4 = bVar1 - 0x30;
              if (((9 < bVar4) && ((byte)((bVar1 & 0xdf) + 0xb9) < 0xfa)) ||
                 (((byte)(((byte *)str)[2] - 0x3a) < 0xf6 &&
                  ((byte)((((byte *)str)[2] & 0xdf) + 0xb9) < 0xfa)))) goto LAB_0019139b;
              if ((byte)(bVar1 - 0x30) < 10) {
LAB_001913d5:
                *pbVar3 = bVar4;
              }
              else {
                if ((byte)(bVar1 + 0x9f) < 6) {
                  bVar4 = bVar1 + 0xa9;
                  goto LAB_001913d5;
                }
                if ((byte)(bVar1 + 0xbf) < 6) {
                  bVar4 = bVar1 - 0x37;
                  goto LAB_001913d5;
                }
              }
              bVar4 = ((byte *)str)[2];
              if ((byte)(bVar4 - 0x30) < 10) {
                bVar4 = (bVar4 + *pbVar3 * '\x10') - 0x30;
LAB_00191415:
                *pbVar3 = bVar4;
              }
              else {
                if ((byte)(bVar4 + 0x9f) < 6) {
                  bVar4 = bVar4 + *pbVar3 * '\x10' + 0xa9;
                  goto LAB_00191415;
                }
                if ((byte)(bVar4 + 0xbf) < 6) {
                  bVar4 = (bVar4 + *pbVar3 * '\x10') - 0x37;
                  goto LAB_00191415;
                }
              }
              str = (char *)((byte *)str + 3);
              iVar5 = -3;
            }
            pbVar3 = pbVar3 + 1;
            uVar7 = iVar6 + iVar5;
            sVar2 = (size_t)uVar7;
          } while (uVar7 != 0 && SCARRY4(iVar6,iVar5) == (int)uVar7 < 0);
        }
        *pbVar3 = 0;
        return (char *)(byte *)target;
      }
      xmlURIErrMemory("unescaping URI value\n");
    }
  }
  return (char *)0x0;
}

Assistant:

char *
xmlURIUnescapeString(const char *str, int len, char *target) {
    char *ret, *out;
    const char *in;

    if (str == NULL)
	return(NULL);
    if (len <= 0) len = strlen(str);
    if (len < 0) return(NULL);

    if (target == NULL) {
	ret = (char *) xmlMallocAtomic(len + 1);
	if (ret == NULL) {
            xmlURIErrMemory("unescaping URI value\n");
	    return(NULL);
	}
    } else
	ret = target;
    in = str;
    out = ret;
    while(len > 0) {
	if ((len > 2) && (*in == '%') && (is_hex(in[1])) && (is_hex(in[2]))) {
	    in++;
	    if ((*in >= '0') && (*in <= '9'))
	        *out = (*in - '0');
	    else if ((*in >= 'a') && (*in <= 'f'))
	        *out = (*in - 'a') + 10;
	    else if ((*in >= 'A') && (*in <= 'F'))
	        *out = (*in - 'A') + 10;
	    in++;
	    if ((*in >= '0') && (*in <= '9'))
	        *out = *out * 16 + (*in - '0');
	    else if ((*in >= 'a') && (*in <= 'f'))
	        *out = *out * 16 + (*in - 'a') + 10;
	    else if ((*in >= 'A') && (*in <= 'F'))
	        *out = *out * 16 + (*in - 'A') + 10;
	    in++;
	    len -= 3;
	    out++;
	} else {
	    *out++ = *in++;
	    len--;
	}
    }
    *out = 0;
    return(ret);
}